

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  
  if (num_bits != 0) {
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    uVar3 = (this->m_output_syms).m_size;
    if ((this->m_output_syms).m_capacity <= uVar3) {
      bVar2 = elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_output_syms,uVar3 + 1,true,8,(object_mover)0x0
                         ,true);
      if (!bVar2) {
        return false;
      }
      uVar3 = (this->m_output_syms).m_size;
    }
    (this->m_output_syms).m_p[uVar3] = (output_symbol)(CONCAT44(num_bits,bits) & 0xffffffffffff);
    puVar1 = &(this->m_output_syms).m_size;
    *puVar1 = *puVar1 + 1;
  }
  return true;
}

Assistant:

bool symbol_codec::record_put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_total_bits_written += num_bits;

      output_symbol sym;
      sym.m_bits = bits;
      sym.m_num_bits = (uint16)num_bits;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }